

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

Generator * kratos::Const::const_gen(void)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  void *local_40;
  Generator *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  undefined1 local_19;
  
  if (const_generator_ == (Generator *)0x0) {
    local_40 = (void *)0x0;
    local_38 = (Generator *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<kratos::Generator,std::allocator<kratos::Generator>,decltype(nullptr),char_const(&)[1]>
              (a_Stack_30,&local_38,(allocator<kratos::Generator> *)&local_19,&local_40,
               (char (*) [1])0x256c24);
    std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<kratos::Generator,kratos::Generator>
              ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)&local_38,local_38);
    _Var1._M_pi = a_Stack_30[0]._M_pi;
    const_generator_ = local_38;
    this = DAT_002d9108;
    local_38 = (Generator *)0x0;
    a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    DAT_002d9108 = _Var1._M_pi;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
    if (a_Stack_30[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_30[0]._M_pi);
    }
  }
  return const_generator_;
}

Assistant:

Generator *Const::const_gen() {
    if (!const_generator_) const_generator_ = std::make_shared<Generator>(nullptr, "");
    return const_generator_.get();
}